

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,REF_DBL *observations)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_HISTOGRAM in_RAX;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  REF_HISTOGRAM ref_histogram;
  REF_HISTOGRAM local_38;
  
  pRVar1 = ref_grid->node;
  local_38 = in_RAX;
  uVar2 = ref_histogram_create(&local_38);
  if (uVar2 == 0) {
    uVar2 = ref_histogram_resolution(local_38,0x120,12.0);
    if (uVar2 == 0) {
      for (lVar4 = 0; lVar4 < pRVar1->max; lVar4 = lVar4 + 1) {
        if (((-1 < pRVar1->global[lVar4]) && (0.0 < observations[lVar4])) &&
           (uVar2 = ref_histogram_add(local_38,observations[lVar4]), uVar2 != 0)) {
          pcVar5 = "add";
          uVar3 = 0x24f;
          goto LAB_001633e2;
        }
      }
      uVar2 = ref_histogram_gather(local_38,ref_grid->mpi);
      if (uVar2 == 0) {
        if ((ref_grid->mpi->id == 0) && (uVar2 = ref_histogram_tec(local_38,"node"), uVar2 != 0)) {
          pcVar5 = "tec";
          uVar3 = 0x255;
        }
        else {
          uVar2 = ref_histogram_free(local_38);
          if (uVar2 == 0) {
            return 0;
          }
          pcVar5 = "free gram";
          uVar3 = 599;
        }
      }
      else {
        pcVar5 = "gather";
        uVar3 = 0x252;
      }
    }
    else {
      pcVar5 = "res";
      uVar3 = 0x24b;
    }
  }
  else {
    pcVar5 = "create";
    uVar3 = 0x24a;
  }
LAB_001633e2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar3
         ,"ref_histogram_node_tec",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_node_tec(REF_GRID ref_grid,
                                          REF_DBL *observations) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_HISTOGRAM ref_histogram;
  REF_INT node;

  RSS(ref_histogram_create(&ref_histogram), "create");
  RSS(ref_histogram_resolution(ref_histogram, 288, 12.0), "res");

  each_ref_node_valid_node(ref_node, node) {
    if (observations[node] > 0.0)
      RSS(ref_histogram_add(ref_histogram, observations[node]), "add");
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_tec(ref_histogram, "node"), "tec");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}